

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O0

OutputFile __thiscall
adios2::burstbuffer::FileDrainer::GetFileForWrite(FileDrainer *this,string *path,bool append)

{
  bool bVar1;
  byte in_CL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  string *in_RSI;
  element_type *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>,_bool>
  pVar3;
  OutputFile OVar4;
  iterator it;
  OutputFile *f;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
  *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  element_type *peVar5;
  undefined7 in_stack_ffffffffffffffb1;
  _Self local_30;
  _Self local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  peVar5 = in_RDI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0xacfc09);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>::shared_ptr
              ((shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
               CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               (shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
               in_stack_ffffffffffffff78);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::make_shared<std::ofstream>();
    pVar3 = std::
            map<std::__cxx11::string,std::shared_ptr<std::ofstream>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::ofstream>>>>
            ::emplace<std::__cxx11::string_const&,std::shared_ptr<std::ofstream>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_>_>_>_>
                        *)in_RDI,in_stack_ffffffffffffff88,
                       (shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
    Open((FileDrainer *)CONCAT71(in_stack_ffffffffffffffb1,pVar3.second),
         (OutputFile *)pVar3.first._M_node._M_node,in_RSI,SUB81((ulong)peVar5 >> 0x38,0));
    _Var2._M_pi = extraout_RDX_00;
  }
  OVar4.
  super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  OVar4.
  super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar5;
  return (OutputFile)
         OVar4.
         super___shared_ptr<std::basic_ofstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

OutputFile FileDrainer::GetFileForWrite(const std::string &path, bool append)
{
    auto it = m_OutputFileMap.find(path);
    if (it != m_OutputFileMap.end())
    {
        return it->second;
    }
    else
    {
        OutputFile f = std::make_shared<std::ofstream>();
        m_OutputFileMap.emplace(path, f);
        Open(f, path, append);
        return f;
    }
}